

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::section(Internal *this,char *title)

{
  long lVar1;
  Internal *this_00;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  
  if ((this->opts).quiet == 0) {
    lVar1 = (this->stats).sections;
    (this->stats).sections = lVar1 + 1;
    if ((lVar1 != 0) && (this->internal != (Internal *)0x0)) {
      message(this->internal);
    }
    print_prefix(this);
    Terminal::blue((Terminal *)tout,false);
    fputs("--- [ ",_stdout);
    Terminal::blue((Terminal *)tout,true);
    fputs(title,_stdout);
    Terminal::blue((Terminal *)tout,false);
    fputs(" ] ",_stdout);
    sVar2 = strlen(title);
    sVar3 = strlen((this->prefix)._M_dataplus._M_p);
    for (iVar4 = (int)sVar2 + (int)sVar3 + 9; iVar4 < 0x4e; iVar4 = iVar4 + 1) {
      fputc(0x2d,_stdout);
    }
    Terminal::normal((Terminal *)tout);
    fputc(10,_stdout);
    this_00 = this->internal;
    if (this_00 != (Internal *)0x0) {
      if ((this_00->opts).quiet != 0) {
        return;
      }
      print_prefix(this_00);
      fputc(10,_stdout);
      fflush(_stdout);
      return;
    }
  }
  return;
}

Assistant:

void Internal::section (const char *title) {
#ifdef LOGGING
  if (!opts.log)
#endif
    if (opts.quiet)
      return;
  if (stats.sections++)
    MSG ();
  print_prefix ();
  tout.blue ();
  fputs ("--- [ ", stdout);
  tout.blue (true);
  fputs (title, stdout);
  tout.blue ();
  fputs (" ] ", stdout);
  for (int i = strlen (title) + strlen (prefix.c_str ()) + 9; i < 78; i++)
    fputc ('-', stdout);
  tout.normal ();
  fputc ('\n', stdout);
  MSG ();
}